

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O2

void test_89(QPDF *pdf,char *arg2)

{
  allocator<char> local_59;
  QPDFObjectHandle local_58 [2];
  string local_38 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_30;
  QPDFObjectHandle null;
  allocator<char> local_18 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_10;
  
  QPDFObjectHandle::newNull();
  QPDF::getTrailer();
  QPDFObjectHandle::appendItem(local_58);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_58[0].super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  QPDF::getRoot();
  QPDFObjectHandle::appendItem(local_58);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_58[0].super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  QPDF::getObjectByID((int)local_38,(int)pdf);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_58,"/X",local_18);
  QPDFObjectHandle::replaceKey(local_38,local_58);
  std::__cxx11::string::~string((string *)local_58);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30);
  QPDF::getObjectByID((int)local_18,(int)pdf);
  QPDFObjectHandle::getArrayItem((int)local_38);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_58,"/X",&local_59);
  QPDFObjectHandle::replaceKey(local_38,local_58);
  std::__cxx11::string::~string((string *)local_58);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_10);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&null.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

static void
test_89(QPDF& pdf, char const* arg2)
{
    // Generate object warning with json-input. Crafted to work with
    // manual-qpdf-json.json.
    auto null = QPDFObjectHandle::newNull();
    pdf.getTrailer().appendItem(null);
    pdf.getRoot().appendItem(null);
    pdf.getObjectByID(5, 0).replaceKey("/X", null);
    pdf.getObjectByID(5, 0).getArrayItem(0).replaceKey("/X", null);
}